

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition
               (sysbvm_context_t *context,sysbvm_functionDefinition_t *definition_)

{
  undefined4 uVar1;
  sysbvm_functionBytecodeDirectCompiler_t *compiler_;
  size_t sVar2;
  sysbvm_tuple_t sVar3;
  sysbvm_tuple_t sVar4;
  sysbvm_object_tuple_t *psVar5;
  sysbvm_tuple_t sVar6;
  sysbvm_tuple_t local_d8;
  uint8_t *destInstructions;
  size_t pc;
  size_t instructionsOffset;
  sysbvm_tuple_t value_1;
  sysbvm_tuple_t binding_1;
  size_t i_1;
  size_t captureCount;
  sysbvm_tuple_t value;
  sysbvm_tuple_t binding;
  size_t i;
  size_t argumentCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_64_8_880fa379 gcFrame;
  sysbvm_functionDefinition_t *definition__local;
  sysbvm_context_t *context_local;
  
  memset(&gcFrameRecord.roots,0,0x40);
  gcFrameRecord.roots = (sysbvm_tuple_t *)definition_;
  memset(&argumentCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentCount);
  sVar6 = gcFrameRecord.roots[0xf];
  compiler_ = (sysbvm_functionBytecodeDirectCompiler_t *)
              sysbvm_functionBytecodeDirectCompiler_create(context);
  compiler_->assembler->sourceEnvironment = *(sysbvm_tuple_t *)(sVar6 + 0x18);
  compiler_->assembler->sourcePosition = *(sysbvm_tuple_t *)(sVar6 + 0x10);
  sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(sVar6 + 0x28));
  sysbvm_functionBytecodeAssembler_setArgumentCount(context,compiler_->assembler,sVar2);
  for (binding = 0; binding < sVar2; binding = binding + 1) {
    sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(sVar6 + 0x28),binding);
    sVar4 = sysbvm_array_at(compiler_->assembler->arguments,binding);
    sysbvm_functionBytecodeDirectCompiler_setBindingValue(context,compiler_,sVar3,sVar4);
  }
  sVar2 = sysbvm_array_getSize(*(sysbvm_tuple_t *)(sVar6 + 0x20));
  sysbvm_functionBytecodeAssembler_setCaptureCount(context,compiler_->assembler,sVar2);
  for (binding_1 = 0; binding_1 < sVar2; binding_1 = binding_1 + 1) {
    sVar3 = sysbvm_array_at(*(sysbvm_tuple_t *)(sVar6 + 0x20),binding_1);
    sVar4 = sysbvm_array_at(compiler_->assembler->captures,binding_1);
    sysbvm_functionBytecodeDirectCompiler_setBindingValue(context,compiler_,sVar3,sVar4);
  }
  if (*(long *)(sVar6 + 0x48) == 0) {
    local_d8 = sysbvm_functionBytecodeAssembler_addLiteral(context,compiler_->assembler,0x2f);
  }
  else {
    local_d8 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                         (context,compiler_,*(sysbvm_tuple_t *)(sVar6 + 0x48));
  }
  if (local_d8 != 0) {
    sysbvm_functionBytecodeAssembler_return(context,compiler_->assembler,local_d8);
  }
  sysbvm_functionBytecodeAssembler_optimizeJumps(context,compiler_->assembler);
  sysbvm_functionBytecodeAssembler_optimizeTemporaries(context,compiler_->assembler);
  sVar2 = sysbvm_orderedCollection_getSize(compiler_->assembler->temporaries);
  sVar3 = sysbvm_tuple_size_encode(context,sVar2);
  compiler_->assembler->usedTemporaryCount = sVar3;
  psVar5 = sysbvm_context_allocatePointerTuple(context,(context->roots).functionBytecodeType,0x12);
  sVar2 = sysbvm_array_getSize(compiler_->assembler->arguments);
  sVar3 = sysbvm_tuple_size_encode(context,sVar2);
  (psVar5->field_1).pointers[0] = sVar3;
  sVar2 = sysbvm_array_getSize(compiler_->assembler->captures);
  sVar3 = sysbvm_tuple_size_encode(context,sVar2);
  psVar5[1].header.field_0.typePointer = sVar3;
  uVar1 = *(undefined4 *)((long)&compiler_->assembler->usedTemporaryCount + 4);
  psVar5[1].header.identityHashAndFlags = *(undefined4 *)&compiler_->assembler->usedTemporaryCount;
  psVar5[1].header.objectSize = uVar1;
  sVar3 = sysbvm_orderedCollection_asArray(context,compiler_->assembler->literals);
  psVar5[1].field_1.pointers[0] = sVar3;
  *(sysbvm_tuple_t **)&psVar5[2].header.identityHashAndFlags = gcFrameRecord.roots;
  psVar5[2].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(sVar6 + 0x28);
  psVar5[3].header.field_0 = *(anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 *)(sVar6 + 0x20);
  sVar3 = sysbvm_orderedCollection_asArray(context,compiler_->assembler->temporaryTypes);
  psVar5[3].header.identityHashAndFlags = (int)sVar3;
  psVar5[3].header.objectSize = (int)(sVar3 >> 0x20);
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[4].field_1.pointers[0] = sVar3;
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[5].header.field_0.typePointer = sVar3;
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[5].header.identityHashAndFlags = (int)sVar3;
  psVar5[5].header.objectSize = (int)(sVar3 >> 0x20);
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[5].field_1.pointers[0] = sVar3;
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[6].header.field_0.typePointer = sVar3;
  sVar3 = sysbvm_tuple_systemHandle_encode(context,0);
  psVar5[6].header.identityHashAndFlags = (int)sVar3;
  psVar5[6].header.objectSize = (int)(sVar3 >> 0x20);
  psVar5[3].field_1 = *(anon_union_8_2_52f2f10a_for_sysbvm_object_tuple_s_1 *)(sVar6 + 0x10);
  sVar6 = sysbvm_orderedOffsetTableBuilder_create(context);
  sVar3 = sysbvm_orderedOffsetTableBuilder_create(context);
  pc = 0;
  for (gcFrame.bytecode = (sysbvm_functionBytecode_t *)compiler_->assembler->firstInstruction;
      gcFrame.bytecode != (sysbvm_functionBytecode_t *)0x0;
      gcFrame.bytecode = (sysbvm_functionBytecode_t *)(gcFrame.bytecode)->literalVector) {
    sVar4 = sysbvm_tuple_size_encode(context,pc);
    (gcFrame.bytecode)->argumentCount = sVar4;
    sVar2 = sysbvm_functionBytecodeAssemblerInstruction_computeAssembledSize
                      (context,(sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)
                               gcFrame.bytecode);
    sVar4 = sysbvm_tuple_size_encode(context,sVar2 + pc);
    (gcFrame.bytecode)->captureVectorSize = sVar4;
    sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
              (context,sVar6,(uint32_t)pc,(gcFrame.bytecode)->instructions);
    sysbvm_orderedOffsetTableBuilder_withOffsetAddValue
              (context,sVar3,(uint32_t)pc,(gcFrame.bytecode)->definition);
    pc = sVar2 + pc;
  }
  sVar4 = sysbvm_byteArray_create(context,pc);
  psVar5[2].header.field_0.typePointer = sVar4;
  pc = 0;
  sVar4 = psVar5[2].header.field_0.typePointer;
  for (gcFrame.bytecode = (sysbvm_functionBytecode_t *)compiler_->assembler->firstInstruction;
      gcFrame.bytecode != (sysbvm_functionBytecode_t *)0x0;
      gcFrame.bytecode = (sysbvm_functionBytecode_t *)(gcFrame.bytecode)->literalVector) {
    sVar2 = sysbvm_functionBytecodeAssemblerInstruction_assembleInto
                      (context,(sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)
                               gcFrame.bytecode,(uint8_t *)(sVar4 + 0x10 + pc));
    pc = sVar2 + pc;
  }
  gcFrameRecord.roots[0x10] = (sysbvm_tuple_t)psVar5;
  gcFrameRecord.roots[0xf] = 0;
  sVar6 = sysbvm_orderedOffsetTableBuilder_finish(context,sVar6);
  psVar5[4].header.field_0.typePointer = sVar6;
  sVar6 = sysbvm_orderedOffsetTableBuilder_finish(context,sVar3);
  psVar5[4].header.identityHashAndFlags = (int)sVar6;
  psVar5[4].header.objectSize = (int)(sVar6 >> 0x20);
  return;
}

Assistant:

SYSBVM_API void sysbvm_functionBytecodeDirectCompiler_compileFunctionDefinition(sysbvm_context_t *context, sysbvm_functionDefinition_t *definition_)
{
    struct {
        sysbvm_functionDefinition_t *definition;
        sysbvm_functionSourceAnalyzedDefinition_t *sourceAnalyzedDefinition;
        sysbvm_functionBytecodeDirectCompiler_t *compiler;
        sysbvm_tuple_t bodyResult;
        sysbvm_functionBytecode_t *bytecode;
        sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction;

        sysbvm_tuple_t debugSourcePositions;
        sysbvm_tuple_t debugSourceEnvironments;
    } gcFrame = {
        .definition = (sysbvm_functionDefinition_t*)definition_,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.sourceAnalyzedDefinition = (sysbvm_functionSourceAnalyzedDefinition_t*)gcFrame.definition->sourceAnalyzedDefinition;

    gcFrame.compiler = (sysbvm_functionBytecodeDirectCompiler_t*)sysbvm_functionBytecodeDirectCompiler_create(context);
    gcFrame.compiler->assembler->sourceEnvironment = gcFrame.sourceAnalyzedDefinition->environment;
    gcFrame.compiler->assembler->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;

    {
        // Make the argument operands.
        size_t argumentCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->arguments);
        sysbvm_functionBytecodeAssembler_setArgumentCount(context, gcFrame.compiler->assembler, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->arguments, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }

        // Make the binding operands.
        size_t captureCount = sysbvm_array_getSize(gcFrame.sourceAnalyzedDefinition->captures);
        sysbvm_functionBytecodeAssembler_setCaptureCount(context, gcFrame.compiler->assembler, captureCount);
        for(size_t i = 0; i < captureCount; ++i)
        {
            sysbvm_tuple_t binding = sysbvm_array_at(gcFrame.sourceAnalyzedDefinition->captures, i);
            sysbvm_tuple_t value = sysbvm_array_at(gcFrame.compiler->assembler->captures, i);
            sysbvm_functionBytecodeDirectCompiler_setBindingValue(context, gcFrame.compiler, binding, value);
        }
    }

    // Compile the body.
    gcFrame.bodyResult = gcFrame.sourceAnalyzedDefinition->bodyNode
        ? sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, gcFrame.compiler, gcFrame.sourceAnalyzedDefinition->bodyNode)
        : sysbvm_functionBytecodeAssembler_addLiteral(context, gcFrame.compiler->assembler, SYSBVM_VOID_TUPLE);

    if(gcFrame.bodyResult)
        sysbvm_functionBytecodeAssembler_return(context, gcFrame.compiler->assembler, gcFrame.bodyResult);

    // Perform some optimizations.
    sysbvm_functionBytecodeAssembler_optimizeJumps(context, gcFrame.compiler->assembler);
    sysbvm_functionBytecodeAssembler_optimizeTemporaries(context, gcFrame.compiler->assembler);
    
    // Assemble the instructions.
    gcFrame.compiler->assembler->usedTemporaryCount = sysbvm_tuple_size_encode(context, sysbvm_orderedCollection_getSize(gcFrame.compiler->assembler->temporaries));

    gcFrame.bytecode = (sysbvm_functionBytecode_t*)sysbvm_context_allocatePointerTuple(context, context->roots.functionBytecodeType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_functionBytecode_t));
    gcFrame.bytecode->argumentCount = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->arguments));
    gcFrame.bytecode->captureVectorSize = sysbvm_tuple_size_encode(context, sysbvm_array_getSize(gcFrame.compiler->assembler->captures));
    gcFrame.bytecode->localVectorSize = gcFrame.compiler->assembler->usedTemporaryCount;
    gcFrame.bytecode->literalVector = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->literals);

    gcFrame.bytecode->definition = (sysbvm_tuple_t)gcFrame.definition;

    gcFrame.bytecode->arguments = gcFrame.sourceAnalyzedDefinition->arguments;
    gcFrame.bytecode->captures = gcFrame.sourceAnalyzedDefinition->captures;
    gcFrame.bytecode->temporaryTypes = sysbvm_orderedCollection_asArray(context, gcFrame.compiler->assembler->temporaryTypes);

    gcFrame.bytecode->jittedCode = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    gcFrame.bytecode->jittedCodeTrampoline = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineWritePointer = sysbvm_tuple_systemHandle_encode(context, 0);
    gcFrame.bytecode->jittedCodeTrampolineSessionToken = sysbvm_tuple_systemHandle_encode(context, 0);

    // Tables for the debug information.
    gcFrame.bytecode->sourcePosition = gcFrame.sourceAnalyzedDefinition->sourcePosition;
    gcFrame.debugSourcePositions = sysbvm_orderedOffsetTableBuilder_create(context);
    gcFrame.debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_create(context);

    // Assemble the instructions.
    size_t instructionsOffset = 0;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
    {
        size_t pc = instructionsOffset;
        gcFrame.instruction->pc = sysbvm_tuple_size_encode(context, instructionsOffset);
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_computeAssembledSize(context, gcFrame.instruction);
        gcFrame.instruction->endPC = sysbvm_tuple_size_encode(context, instructionsOffset);

        // Add the debug annotations.
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourcePositions, (uint32_t)pc, gcFrame.instruction->sourcePosition);
        sysbvm_orderedOffsetTableBuilder_withOffsetAddValue(context, gcFrame.debugSourceEnvironments, (uint32_t)pc, gcFrame.instruction->sourceEnvironment);
    }

    gcFrame.bytecode->instructions = sysbvm_byteArray_create(context, instructionsOffset);
    instructionsOffset = 0;
    uint8_t *destInstructions = SYSBVM_CAST_OOP_TO_OBJECT_TUPLE(gcFrame.bytecode->instructions)->bytes;
    for(gcFrame.instruction = gcFrame.compiler->assembler->firstInstruction; gcFrame.instruction; gcFrame.instruction = gcFrame.instruction->next)
        instructionsOffset += sysbvm_functionBytecodeAssemblerInstruction_assembleInto(context, gcFrame.instruction, destInstructions + instructionsOffset);

    // Finish by installing it on the definition.
    gcFrame.definition->bytecode = (sysbvm_tuple_t)gcFrame.bytecode;
    gcFrame.definition->sourceAnalyzedDefinition = SYSBVM_NULL_TUPLE;

    gcFrame.bytecode->debugSourcePositions = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourcePositions);
    gcFrame.bytecode->debugSourceEnvironments = sysbvm_orderedOffsetTableBuilder_finish(context, gcFrame.debugSourceEnvironments);
}